

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-desc.c
# Opt level: O0

size_t obj_desc_chest(object *obj,char *buf,size_t max,size_t end)

{
  size_t max_00;
  size_t str;
  _Bool _Var1;
  char *pcVar2;
  object *local_30;
  size_t end_local;
  size_t max_local;
  char *buf_local;
  object *obj_local;
  
  local_30 = (object *)end;
  end_local = max;
  max_local = (size_t)buf;
  buf_local = (char *)obj;
  _Var1 = tval_is_chest(obj);
  str = max_local;
  max_00 = end_local;
  if (_Var1) {
    if ((*(short *)(buf_local + 0x3e) == 0) || (*(short *)(*(long *)(buf_local + 0x28) + 0x3e) != 0)
       ) {
      pcVar2 = chest_trap_name((object *)buf_local);
      strnfcat((char *)str,max_00,(size_t *)&local_30," (%s)",pcVar2);
      obj_local = local_30;
    }
    else {
      obj_local = local_30;
    }
  }
  else {
    obj_local = local_30;
  }
  return (size_t)obj_local;
}

Assistant:

static size_t obj_desc_chest(const struct object *obj, char *buf, size_t max,
							 size_t end)
{
	if (!tval_is_chest(obj)) return end;

	/* The chest is unopened, but we know nothing about its trap/lock */
	if (obj->pval && !obj->known->pval) return end;

	/* Describe the traps */
	strnfcat(buf, max, &end, " (%s)", chest_trap_name(obj));

	return end;
}